

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzvec.h
# Opt level: O1

void __thiscall
TPZVec<std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>_>::Resize
          (TPZVec<std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>_>
           *this,int64_t newsize,
          map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> *object)

{
  map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> *pmVar1;
  size_t sVar2;
  undefined1 auVar3 [16];
  int64_t *piVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  ulong uVar8;
  _Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
  *this_00;
  map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> *pmVar9;
  
  if (newsize < 0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"TPZVec::Resize. Bad parameter newsize.",0x26);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + ' ');
    std::ostream::put(' ');
    std::ostream::flush();
    std::ostream::flush();
    return;
  }
  lVar7 = this->fNElements;
  if (lVar7 != newsize) {
    if (newsize == 0) {
      pmVar9 = (map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> *)0x0;
    }
    else {
      auVar3._8_8_ = 0;
      auVar3._0_8_ = newsize;
      uVar8 = 0xffffffffffffffff;
      if (SUB168(auVar3 * ZEXT816(0x30),8) == 0) {
        uVar8 = SUB168(auVar3 * ZEXT816(0x30),0) | 8;
      }
      piVar4 = (int64_t *)operator_new__(uVar8);
      *piVar4 = newsize;
      pmVar9 = (map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> *)
               (piVar4 + 1);
      piVar4 = piVar4 + 2;
      lVar5 = newsize * 0x30;
      do {
        *(undefined4 *)piVar4 = 0;
        piVar4[1] = 0;
        piVar4[2] = (int64_t)piVar4;
        piVar4[3] = (int64_t)piVar4;
        piVar4[4] = 0;
        piVar4 = piVar4 + 6;
        lVar5 = lVar5 + -0x30;
      } while (lVar5 != 0);
    }
    if (newsize <= lVar7) {
      lVar7 = newsize;
    }
    if (lVar7 < 1) {
      lVar5 = 0;
    }
    else {
      lVar6 = 0;
      lVar5 = 0;
      do {
        std::
        _Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
        ::operator=((_Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                     *)((long)&(pmVar9->_M_t)._M_impl.field_0x0 + lVar6),
                    (_Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                     *)(&(this->fStore->_M_t)._M_impl.field_0x0 + lVar6));
        lVar5 = lVar5 + 1;
        lVar6 = lVar6 + 0x30;
      } while (lVar7 != lVar5);
    }
    lVar7 = newsize - lVar5;
    if (lVar7 != 0 && lVar5 <= newsize) {
      this_00 = &pmVar9[lVar5]._M_t;
      do {
        std::
        _Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
        ::operator=(this_00,&object->_M_t);
        this_00 = this_00 + 1;
        lVar7 = lVar7 + -1;
      } while (lVar7 != 0);
    }
    pmVar1 = this->fStore;
    if (pmVar1 != (map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> *)0x0)
    {
      sVar2 = pmVar1[-1]._M_t._M_impl.super__Rb_tree_header._M_node_count;
      if (sVar2 != 0) {
        lVar7 = sVar2 * 0x30;
        do {
          std::
          _Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
          ::~_Rb_tree((_Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                       *)(&pmVar1[-1]._M_t._M_impl.field_0x0 + lVar7));
          lVar7 = lVar7 + -0x30;
        } while (lVar7 != 0);
      }
      operator_delete__(&pmVar1[-1]._M_t._M_impl.super__Rb_tree_header._M_node_count,
                        sVar2 * 0x30 + 8);
      this->fStore = (map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> *)
                     0x0;
    }
    this->fStore = pmVar9;
    this->fNElements = newsize;
    this->fNAlloc = newsize;
  }
  return;
}

Assistant:

void TPZVec<T>::Resize(const int64_t newsize,const T& object) {
#ifndef PZNODEBUG
	if(newsize<0) {
		PZError << "TPZVec::Resize. Bad parameter newsize." << std::endl;
		PZError.flush();
		return;
	}
#endif
	if(newsize == fNElements) return;
	T* newstore;
	if(newsize) newstore = new T[newsize];
	else newstore = 0;
	int64_t large = (fNElements < newsize) ? fNElements : newsize;
	int64_t i;
	for(i=0L; i<large; i++) {
		newstore[i] = fStore[i];
	}
	for(;i<newsize;i++) {   // then only to case : large=fNElement < newsize
		newstore[i] = object;
	}
    if(fStore) {
        delete[] fStore;
        fStore = nullptr;
    }
	fStore = newstore;
	fNElements = newsize;//cedric 20/11/99 e 29/04/00
    fNAlloc = newsize;
}